

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O0

void raster_size(char *fn,int num,int *x,int *y)

{
  int __fd;
  ssize_t sVar1;
  char local_e8 [4];
  int fd;
  string s2;
  string s1;
  raster_t hd;
  int *y_local;
  int *x_local;
  int num_local;
  char *fn_local;
  
  sprintf(s2 + 0x48,"%d",(ulong)(uint)num);
  concat(fn,s2 + 0x48,local_e8);
  __fd = open(local_e8,0);
  if (__fd < 1) {
    error(6);
  }
  else {
    sVar1 = read(__fd,s1 + 0x48,0x20);
    if (sVar1 == 0x20) {
      *x = s1._76_4_;
      *y = hd.m;
      if ((0x13c < *x) || (0x13c < *y)) {
        error(10);
      }
    }
  }
  close(__fd);
  return;
}

Assistant:

void raster_size(fn,num,x,y)
char *fn ;
int num, *x, *y ;

{ raster_t hd ;
  string s1, s2 ;
  int fd ;

  sprintf(s1,"%d",num);
  concat(fn,s1,s2) ;
  if ((fd = open(s2,O_RDONLY)) > 0) {
    if (read(fd,&hd,sizeof(hd)) == sizeof(hd)) {
      *x = hd.width ;
      *y = hd.height ;
      if (*x > X || *y > Y) {
        error(10) ;
      }
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}